

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O3

QSslCipher __thiscall
QTlsBackend::createCiphersuite
          (QTlsBackend *this,QString *descriptionOneLine,int bits,int supportedBits)

{
  QStringView *pQVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  long lVar4;
  int *piVar5;
  char cVar6;
  undefined1 uVar7;
  CutResult CVar8;
  undefined4 uVar9;
  qsizetype qVar10;
  QChar *pQVar11;
  long lVar12;
  long in_FS_OFFSET;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QLatin1String QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QStringView QVar24;
  QString local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QSslCipher::QSslCipher((QSslCipher *)this);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  local_78.d.ptr = (descriptionOneLine->d).ptr;
  local_78.d.d = (Data *)(descriptionOneLine->d).size;
  QStringView::split(&local_58,&local_78,0x20,1,1);
  if (local_48 < (undefined1 *)0x6) goto LAB_001d1ec7;
  **(undefined1 **)this = 0;
  QString::QString(&local_78,(QChar *)((longlong *)CONCAT44(uStack_4c,uStack_50))[1],
                   *(longlong *)CONCAT44(uStack_4c,uStack_50));
  lVar12 = *(long *)this;
  pQVar2 = *(QArrayData **)(lVar12 + 8);
  *(Data **)(lVar12 + 8) = local_78.d.d;
  pcVar3 = *(char16_t **)(lVar12 + 0x10);
  *(char16_t **)(lVar12 + 0x10) = local_78.d.ptr;
  qVar10 = *(qsizetype *)(lVar12 + 0x18);
  *(qsizetype *)(lVar12 + 0x18) = local_78.d.size;
  local_78.d.d = (Data *)pQVar2;
  local_78.d.ptr = pcVar3;
  local_78.d.size = qVar10;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  pQVar1 = (QStringView *)(CONCAT44(uStack_4c,uStack_50) + 0x10);
  lVar12 = pQVar1->m_size;
  pQVar11 = *(QChar **)(CONCAT44(uStack_4c,uStack_50) + 0x18);
  QVar13 = *pQVar1;
  QString::QString(&local_78,pQVar11,lVar12);
  lVar4 = *(long *)this;
  pQVar2 = *(QArrayData **)(lVar4 + 0x78);
  pcVar3 = *(char16_t **)(lVar4 + 0x80);
  *(Data **)(lVar4 + 0x78) = local_78.d.d;
  *(char16_t **)(lVar4 + 0x80) = local_78.d.ptr;
  qVar10 = *(qsizetype *)(lVar4 + 0x88);
  *(qsizetype *)(lVar4 + 0x88) = local_78.d.size;
  local_78.d.d = (Data *)pQVar2;
  local_78.d.ptr = pcVar3;
  local_78.d.size = qVar10;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  lVar4 = *(long *)this;
  *(undefined4 *)(lVar4 + 0x90) = 0xffffffff;
  QVar17.m_data = L"TLSv1";
  QVar17.m_size = 5;
  cVar6 = QtPrivate::startsWith(QVar13,QVar17,CaseSensitive);
  if (cVar6 != '\0') {
    uVar9 = 0;
    if (lVar12 != 5) {
      if ((pQVar11[5].ucs != L'.') || (lVar12 != 7)) goto LAB_001d1c54;
      pQVar11 = pQVar11 + 6;
      QVar13.m_data = &pQVar11->ucs;
      QVar13.m_size = 1;
      QVar18.m_data = L"3";
      QVar18.m_size = 1;
      cVar6 = QtPrivate::equalStrings(QVar13,QVar18);
      uVar9 = 0xc;
      if (cVar6 == '\0') {
        QVar14.m_data = &pQVar11->ucs;
        QVar14.m_size = 1;
        QVar19.m_data = L"2";
        QVar19.m_size = 1;
        cVar6 = QtPrivate::equalStrings(QVar14,QVar19);
        uVar9 = 2;
        if (cVar6 == '\0') {
          QVar15.m_data = &pQVar11->ucs;
          QVar15.m_size = 1;
          QVar20.m_data = L"1";
          QVar20.m_size = 1;
          cVar6 = QtPrivate::equalStrings(QVar15,QVar20);
          uVar9 = 1;
          if (cVar6 == '\0') goto LAB_001d1c54;
        }
      }
    }
    *(undefined4 *)(lVar4 + 0x90) = uVar9;
  }
LAB_001d1c54:
  lVar12 = CONCAT44(uStack_4c,uStack_50);
  qVar10 = ((QStringView *)(lVar12 + 0x20))->m_size;
  QVar21.m_data = "Kx=";
  QVar21.m_size = 3;
  cVar6 = QtPrivate::startsWith(*(QStringView *)(lVar12 + 0x20),QVar21,CaseSensitive);
  if (cVar6 != '\0') {
    local_78.d.d = (Data *)0x3;
    local_40 = -1;
    CVar8 = QtPrivate::QContainerImplHelper::mid(qVar10,(qsizetype *)&local_78,&local_40);
    if (CVar8 == Null) {
      qVar10 = 0;
      pQVar11 = (QChar *)0x0;
    }
    else {
      pQVar11 = (QChar *)((long)local_78.d.d * 2 + *(long *)(lVar12 + 0x28));
      qVar10 = local_40;
    }
    QString::QString(&local_78,pQVar11,qVar10);
    lVar12 = *(long *)this;
    pQVar2 = *(QArrayData **)(lVar12 + 0x28);
    pcVar3 = *(char16_t **)(lVar12 + 0x30);
    *(Data **)(lVar12 + 0x28) = local_78.d.d;
    *(char16_t **)(lVar12 + 0x30) = local_78.d.ptr;
    qVar10 = *(qsizetype *)(lVar12 + 0x38);
    *(qsizetype *)(lVar12 + 0x38) = local_78.d.size;
    local_78.d.d = (Data *)pQVar2;
    local_78.d.ptr = pcVar3;
    local_78.d.size = qVar10;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    lVar12 = CONCAT44(uStack_4c,uStack_50);
  }
  qVar10 = ((QStringView *)(lVar12 + 0x30))->m_size;
  QVar22.m_data = "Au=";
  QVar22.m_size = 3;
  cVar6 = QtPrivate::startsWith(*(QStringView *)(lVar12 + 0x30),QVar22,CaseSensitive);
  if (cVar6 != '\0') {
    local_78.d.d = (Data *)0x3;
    local_40 = -1;
    CVar8 = QtPrivate::QContainerImplHelper::mid(qVar10,(qsizetype *)&local_78,&local_40);
    if (CVar8 == Null) {
      qVar10 = 0;
      pQVar11 = (QChar *)0x0;
    }
    else {
      pQVar11 = (QChar *)((long)local_78.d.d * 2 + *(long *)(lVar12 + 0x38));
      qVar10 = local_40;
    }
    QString::QString(&local_78,pQVar11,qVar10);
    lVar12 = *(long *)this;
    pQVar2 = *(QArrayData **)(lVar12 + 0x40);
    pcVar3 = *(char16_t **)(lVar12 + 0x48);
    *(Data **)(lVar12 + 0x40) = local_78.d.d;
    *(char16_t **)(lVar12 + 0x48) = local_78.d.ptr;
    qVar10 = *(qsizetype *)(lVar12 + 0x50);
    *(qsizetype *)(lVar12 + 0x50) = local_78.d.size;
    local_78.d.d = (Data *)pQVar2;
    local_78.d.ptr = pcVar3;
    local_78.d.size = qVar10;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    lVar12 = CONCAT44(uStack_4c,uStack_50);
  }
  qVar10 = ((QStringView *)(lVar12 + 0x40))->m_size;
  QVar23.m_data = "Enc=";
  QVar23.m_size = 4;
  cVar6 = QtPrivate::startsWith(*(QStringView *)(lVar12 + 0x40),QVar23,CaseSensitive);
  if (cVar6 != '\0') {
    local_78.d.d = (Data *)&DAT_00000004;
    local_40 = -1;
    CVar8 = QtPrivate::QContainerImplHelper::mid(qVar10,(qsizetype *)&local_78,&local_40);
    if (CVar8 == Null) {
      qVar10 = 0;
      pQVar11 = (QChar *)0x0;
    }
    else {
      pQVar11 = (QChar *)((long)local_78.d.d * 2 + *(long *)(lVar12 + 0x48));
      qVar10 = local_40;
    }
    QString::QString(&local_78,pQVar11,qVar10);
    lVar12 = *(long *)this;
    pQVar2 = *(QArrayData **)(lVar12 + 0x58);
    pcVar3 = *(char16_t **)(lVar12 + 0x60);
    *(undefined4 *)(lVar12 + 0x58) = local_78.d.d._0_4_;
    *(undefined4 *)(lVar12 + 0x5c) = local_78.d.d._4_4_;
    *(undefined4 *)(lVar12 + 0x60) = local_78.d.ptr._0_4_;
    *(undefined4 *)(lVar12 + 100) = local_78.d.ptr._4_4_;
    qVar10 = *(qsizetype *)(lVar12 + 0x68);
    *(qsizetype *)(lVar12 + 0x68) = local_78.d.size;
    local_78.d.d = (Data *)pQVar2;
    local_78.d.ptr = pcVar3;
    local_78.d.size = qVar10;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
  }
  if ((local_48 < (undefined1 *)0x7) || (*(long *)(CONCAT44(uStack_4c,uStack_50) + 0x60) != 6)) {
    uVar7 = 0;
  }
  else {
    QVar16.m_data = "export";
    QVar16.m_size = 6;
    QVar24.m_data = *(storage_type_conflict **)(CONCAT44(uStack_4c,uStack_50) + 0x68);
    QVar24.m_size = 6;
    uVar7 = QtPrivate::equalStrings(QVar16,QVar24);
  }
  lVar12 = *(long *)this;
  *(undefined1 *)(lVar12 + 0x70) = uVar7;
  *(int *)(lVar12 + 0x24) = bits;
  *(int *)(lVar12 + 0x20) = supportedBits;
LAB_001d1ec7:
  piVar5 = (int *)CONCAT44(uStack_54,local_58);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)
           (unique_ptr<QSslCipherPrivate,_std::default_delete<QSslCipherPrivate>_>)this;
  }
  __stack_chk_fail();
}

Assistant:

QSslCipher QTlsBackend::createCiphersuite(const QString &descriptionOneLine, int bits, int supportedBits)
{
    QSslCipher ciph;

    const auto descriptionList = QStringView{descriptionOneLine}.split(u' ', Qt::SkipEmptyParts);
    if (descriptionList.size() > 5) {
        ciph.d->isNull = false;
        ciph.d->name = descriptionList.at(0).toString();

        QStringView protoString = descriptionList.at(1);
        ciph.d->protocolString = protoString.toString();
        ciph.d->protocol = QSsl::UnknownProtocol;
QT_WARNING_PUSH
QT_WARNING_DISABLE_DEPRECATED
        if (protoString.startsWith(u"TLSv1")) {
            QStringView tail = protoString.sliced(5);
            if (tail.startsWith(u'.')) {
                tail = tail.sliced(1);
                if (tail == u"3")
                    ciph.d->protocol = QSsl::TlsV1_3;
                else if (tail == u"2")
                    ciph.d->protocol = QSsl::TlsV1_2;
                else if (tail == u"1")
                    ciph.d->protocol = QSsl::TlsV1_1;
            } else if (tail.isEmpty()) {
                ciph.d->protocol = QSsl::TlsV1_0;
            }
        }
QT_WARNING_POP

        if (descriptionList.at(2).startsWith("Kx="_L1))
            ciph.d->keyExchangeMethod = descriptionList.at(2).mid(3).toString();
        if (descriptionList.at(3).startsWith("Au="_L1))
            ciph.d->authenticationMethod = descriptionList.at(3).mid(3).toString();
        if (descriptionList.at(4).startsWith("Enc="_L1))
            ciph.d->encryptionMethod = descriptionList.at(4).mid(4).toString();
        ciph.d->exportable = (descriptionList.size() > 6 && descriptionList.at(6) == "export"_L1);

        ciph.d->bits = bits;
        ciph.d->supportedBits = supportedBits;
    }

    return ciph;
}